

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

TokenPtr __thiscall Assimp::FBX::Parser::AdvanceToNextToken(Parser *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_20;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_18;
  Parser *local_10;
  Parser *this_local;
  
  this->last = this->current;
  local_10 = this;
  local_18._M_current =
       (Token **)
       std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::end
                 (this->tokens);
  bVar1 = __gnu_cxx::operator==(&this->cursor,&local_18);
  if (bVar1) {
    this->current = (TokenPtr)0x0;
  }
  else {
    local_20 = __gnu_cxx::
               __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
               ::operator++(&this->cursor,0);
    ppTVar2 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
              ::operator*(&local_20);
    this->current = *ppTVar2;
  }
  return this->current;
}

Assistant:

TokenPtr Parser::AdvanceToNextToken()
{
    last = current;
    if (cursor == tokens.end()) {
        current = NULL;
    } else {
        current = *cursor++;
    }
    return current;
}